

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeSetVarmask(Vdbe *v,int iVar)

{
  int iVar_local;
  Vdbe *v_local;
  
  if (iVar < 0x20) {
    v->expmask = 1 << ((char)iVar - 1U & 0x1f) | v->expmask;
  }
  else {
    v->expmask = v->expmask | 0x80000000;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeSetVarmask(Vdbe *v, int iVar){
  assert( iVar>0 );
  assert( (v->db->flags & SQLITE_EnableQPSG)==0
       || (v->db->mDbFlags & DBFLAG_InternalFunc)!=0 );
  if( iVar>=32 ){
    v->expmask |= 0x80000000;
  }else{
    v->expmask |= ((u32)1 << (iVar-1));
  }
}